

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O2

bool __thiscall search::BSTree::find(BSTree *this,int key,Record **r)

{
  BSTNode *pBVar1;
  
  if (this->root_ == (BSTNode *)0x0) {
    return false;
  }
  pBVar1 = BSTNode::search(this->root_,key);
  if (pBVar1 != (BSTNode *)0x0) {
    *r = pBVar1;
  }
  return pBVar1 != (BSTNode *)0x0;
}

Assistant:

bool BSTree::find(int key, Record*& r)
    {
        if (!root_)
            return false;
        auto ret =  root_->search(key);
        if (ret)
        {
            r = ret;
            return true;
        }
        else
            return false;
    }